

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sensors.cpp
# Opt level: O0

Sensor * __thiscall
iDynTree::SensorsList::getSensor(SensorsList *this,SensorType *sensor_type,ptrdiff_t sensor_index)

{
  size_t sVar1;
  reference this_00;
  reference ppSVar2;
  ostream *poVar3;
  void *this_01;
  size_type in_RDX;
  uint *in_RSI;
  SensorsList *in_RDI;
  SensorType *in_stack_ffffffffffffffc8;
  value_type local_8;
  
  sVar1 = getNrOfSensors(in_RDI,in_stack_ffffffffffffffc8);
  if (((long)in_RDX < (long)(int)sVar1) && (-1 < (long)in_RDX)) {
    this_00 = std::
              vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
              ::operator[](&in_RDI->pimpl->allSensors,(ulong)*in_RSI);
    ppSVar2 = std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>::operator[]
                        (this_00,in_RDX);
    local_8 = *ppSVar2;
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"[ERROR] getSensor did not find sensor ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_RDX);
    poVar3 = std::operator<<(poVar3," of type ");
    this_01 = (void *)std::ostream::operator<<(poVar3,*in_RSI);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    local_8 = (value_type)0x0;
  }
  return local_8;
}

Assistant:

Sensor* SensorsList::getSensor(const SensorType& sensor_type, std::ptrdiff_t sensor_index) const
{
    if( sensor_index < (int)getNrOfSensors(sensor_type) && sensor_index >= 0 )
    {
        return this->pimpl->allSensors[sensor_type][sensor_index];
    }
    else
    {
        std::cerr << "[ERROR] getSensor did not find sensor "
                  << sensor_index << " of type " << sensor_type
                  << std::endl;
        return 0;
    }
}